

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemFlags extra_flags)

{
  ImGuiItemStatusFlags *pIVar1;
  int *piVar2;
  short *psVar3;
  ImRect *pIVar4;
  ImVec2 IVar5;
  ImGuiNavLayer IVar6;
  uint uVar7;
  int iVar8;
  ImGuiWindow *pIVar9;
  ImGuiWindow *pIVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  ImGuiID id_1;
  ImGuiNavItemData *pIVar15;
  ImGuiWindow *window;
  ImGuiContext *g;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  pIVar11 = GImGui;
  pIVar9 = GImGui->CurrentWindow;
  (GImGui->LastItemData).ID = id;
  IVar5 = bb->Max;
  (pIVar11->LastItemData).Rect.Min = bb->Min;
  (pIVar11->LastItemData).Rect.Max = IVar5;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  IVar5 = nav_bb_arg->Max;
  (pIVar11->LastItemData).NavRect.Min = nav_bb_arg->Min;
  (pIVar11->LastItemData).NavRect.Max = IVar5;
  uVar14 = extra_flags | pIVar11->CurrentItemFlags;
  (pIVar11->LastItemData).InFlags = uVar14;
  (pIVar11->LastItemData).StatusFlags = 0;
  if (id == 0) goto LAB_00119108;
  IVar6 = (pIVar9->DC).NavLayerCurrent;
  psVar3 = &(pIVar9->DC).NavLayersActiveMaskNext;
  *psVar3 = *psVar3 | (ushort)(1 << ((byte)IVar6 & 0x1f));
  if ((((pIVar11->NavId != id) && (pIVar11->NavAnyRequest != true)) ||
      (pIVar10 = pIVar11->NavWindow, pIVar10->RootWindowForNav != pIVar9->RootWindowForNav)) ||
     ((pIVar9 != pIVar10 && (((uint)(pIVar10->Flags | pIVar9->Flags) >> 0x17 & 1) == 0))))
  goto LAB_00119108;
  IVar5 = (pIVar11->LastItemData).NavRect.Min;
  fVar19 = IVar5.x;
  fVar20 = IVar5.y;
  IVar5 = (pIVar11->LastItemData).NavRect.Max;
  fVar21 = IVar5.x;
  fVar22 = IVar5.y;
  if ((pIVar11->NavInitRequest == true) && (pIVar11->NavLayer == IVar6)) {
    if (((uVar14 & 0x14) == 0) || (pIVar11->NavInitResultId == 0)) {
      pIVar11->NavInitResultId = id;
      IVar5 = (pIVar9->DC).CursorStartPos;
      fVar16 = IVar5.x;
      fVar17 = IVar5.y;
      (pIVar11->NavInitResultRectRel).Min.x = fVar19 - fVar16;
      (pIVar11->NavInitResultRectRel).Min.y = fVar20 - fVar17;
      (pIVar11->NavInitResultRectRel).Max.x = fVar21 - fVar16;
      (pIVar11->NavInitResultRectRel).Max.y = fVar22 - fVar17;
    }
    if ((uVar14 & 0x14) == 0) {
      pIVar11->NavInitRequest = false;
      pIVar11->NavAnyRequest = pIVar11->NavMoveScoringItems;
    }
  }
  if (pIVar11->NavMoveScoringItems == true) {
    uVar7 = pIVar11->NavMoveFlags;
    if ((uVar7 >> 10 & 1) == 0) {
      if ((uVar14 & 0xc) == 0 && ((uVar7 & 0x10) != 0 || pIVar11->NavId != id)) {
        pIVar15 = &pIVar11->NavMoveResultOther;
        if (pIVar9 == pIVar11->NavWindow) {
          pIVar15 = &pIVar11->NavMoveResultLocal;
        }
        bVar12 = NavScoreItem(pIVar15);
        if (bVar12) {
          NavApplyItemToResult(pIVar15);
        }
        if (((((pIVar11->NavMoveFlags & 0x20) != 0) &&
             (fVar16 = (pIVar9->ClipRect).Max.y, fVar20 < fVar16)) &&
            (fVar17 = (pIVar9->ClipRect).Min.y, fVar17 < fVar22)) &&
           ((fVar19 < (pIVar9->ClipRect).Max.x &&
            ((pIVar9->ClipRect).Min.x <= fVar21 && fVar21 != (pIVar9->ClipRect).Min.x)))) {
          fVar18 = fVar16;
          if (fVar22 <= fVar16) {
            fVar18 = fVar22;
          }
          if (fVar20 <= fVar16) {
            fVar16 = fVar20;
          }
          if ((fVar22 - fVar20) * 0.7 <=
              (float)(-(uint)(fVar22 < fVar17) & (uint)fVar17 |
                     ~-(uint)(fVar22 < fVar17) & (uint)fVar18) -
              (float)(-(uint)(fVar20 < fVar17) & (uint)fVar17 |
                     ~-(uint)(fVar20 < fVar17) & (uint)fVar16)) {
            pIVar15 = &pIVar11->NavMoveResultLocalVisible;
            bVar12 = NavScoreItem(pIVar15);
            if (bVar12) goto LAB_00119485;
          }
        }
      }
    }
    else if ((uVar14 & 0x105) == 0x100 || (uVar7 >> 9 & 1) != 0) {
      pIVar15 = &pIVar11->NavMoveResultLocal;
      iVar8 = pIVar11->NavTabbingDir;
      if (iVar8 == -1) {
        if (pIVar11->NavId == id) {
          if ((pIVar11->NavMoveResultLocal).ID != 0) {
            pIVar11->NavMoveScoringItems = false;
            pIVar11->NavAnyRequest = pIVar11->NavInitRequest;
          }
        }
        else {
LAB_00119485:
          NavApplyItemToResult(pIVar15);
        }
      }
      else if (iVar8 == 0) {
        if ((pIVar11->NavTabbingResultFirst).ID == 0) {
          pIVar15 = &pIVar11->NavTabbingResultFirst;
          pIVar11->NavMoveScoringItems = false;
LAB_001194b4:
          NavApplyItemToResult(pIVar15);
          bVar12 = true;
          if (GImGui->NavMoveScoringItems == false) {
            bVar12 = GImGui->NavInitRequest;
          }
          GImGui->NavAnyRequest = bVar12;
        }
      }
      else if (iVar8 == 1) {
        if ((pIVar11->NavTabbingResultFirst).ID == 0) {
          NavApplyItemToResult(&pIVar11->NavTabbingResultFirst);
        }
        piVar2 = &pIVar11->NavTabbingCounter;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          GImGui->NavMoveScoringItems = false;
          goto LAB_001194b4;
        }
        if (pIVar11->NavId == id) {
          pIVar11->NavTabbingCounter = 1;
        }
      }
    }
  }
  if (pIVar11->NavId == id) {
    pIVar11->NavWindow = pIVar9;
    IVar6 = (pIVar9->DC).NavLayerCurrent;
    pIVar11->NavLayer = IVar6;
    pIVar11->NavFocusScopeId = (pIVar9->DC).NavFocusScopeIdCurrent;
    pIVar11->NavIdIsAlive = true;
    IVar5 = (pIVar9->DC).CursorStartPos;
    fVar16 = IVar5.x;
    fVar17 = IVar5.y;
    pIVar4 = pIVar9->NavRectRel + IVar6;
    (pIVar4->Min).x = fVar19 - fVar16;
    (pIVar4->Min).y = fVar20 - fVar17;
    (pIVar4->Max).x = fVar21 - fVar16;
    (pIVar4->Max).y = fVar22 - fVar17;
  }
LAB_00119108:
  (pIVar11->NextItemData).Flags = 0;
  bVar12 = IsClippedEx(bb,id);
  if ((!bVar12) && (bVar13 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar13)) {
    pIVar1 = &(pIVar11->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 1;
  }
  return !bVar12;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Set item data
    // (DisplayRect is left untouched, made valid when ImGuiItemStatusFlags_HasDisplayRect is set)
    g.LastItemData.ID = id;
    g.LastItemData.Rect = bb;
    g.LastItemData.NavRect = nav_bb_arg ? *nav_bb_arg : bb;
    g.LastItemData.InFlags = g.CurrentItemFlags | extra_flags;
    g.LastItemData.StatusFlags = ImGuiItemStatusFlags_None;

    // Directional navigation processing
    if (id != 0)
    {
        // Runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem();

        // [DEBUG] People keep stumbling on this problem and using "" as identifier in the root of a window instead of "##something".
        // Empty identifier are valid and useful in a small amount of cases, but 99.9% of the time you want to use "##something".
        // READ THE FAQ: https://dearimgui.org/faq
        IM_ASSERT(id != window->ID && "Cannot have an empty ID at the root of a window. If you need an empty label, use ## and read the FAQ about how the ID Stack works!");

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}